

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

string * __thiscall
t_rb_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rb_generator *this,t_type *ttype)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string name;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,"",(allocator *)&bStack_98);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  std::__cxx11::string::string((string *)&bStack_98,(string *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar1 == '\0') goto LAB_002932e2;
    }
  }
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  std::__cxx11::string::string((string *)&local_78,(string *)CONCAT44(extraout_var_00,iVar1));
  t_generator::capitalize(&local_38,(t_generator *)this,&local_78);
  std::__cxx11::string::operator=((string *)&bStack_98,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
LAB_002932e2:
  std::operator+(__return_storage_ptr__,&local_58,&bStack_98);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string t_rb_generator::type_name(const t_type* ttype) {
  string prefix = "";

  string name = ttype->get_name();
  if (ttype->is_struct() || ttype->is_xception() || ttype->is_enum()) {
    name = capitalize(ttype->get_name());
  }

  return prefix + name;
}